

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

ON__UINT64 __thiscall
ON_SerialNumberMap::GarbageCollectMoveHelper
          (ON_SerialNumberMap *this,ON_SN_BLOCK *dst,ON_SN_BLOCK *src)

{
  uint local_2c;
  uint local_28;
  ON__UINT32 n;
  ON__UINT32 j;
  ON__UINT32 i;
  ON_SN_BLOCK *src_local;
  ON_SN_BLOCK *dst_local;
  ON_SerialNumberMap *this_local;
  
  if ((src == (ON_SN_BLOCK *)0x0) || (dst == (ON_SN_BLOCK *)0x0)) {
    local_2c = 0;
  }
  else {
    local_2c = 0x2000 - dst->m_count;
    if (src->m_count < local_2c) {
      local_2c = src->m_count;
    }
    if (local_2c != 0) {
      if (dst->m_count == 0) {
        ON_SN_BLOCK::EmptyBlock(dst);
      }
      if ((src->m_sorted == 0) && (dst->m_sorted = 0, dst->m_count == 0)) {
        dst->m_sn0 = src->m_sn0;
        dst->m_sn1 = src->m_sn1;
      }
      memcpy(dst->m_sn + dst->m_count,src->m_sn,(ulong)local_2c * 0x38);
      dst->m_count = local_2c + dst->m_count;
      if (dst->m_sorted == 0) {
        if (src->m_sn0 < dst->m_sn0) {
          dst->m_sn0 = src->m_sn0;
        }
        if (dst->m_sn1 < src->m_sn1) {
          dst->m_sn1 = src->m_sn1;
        }
      }
      else {
        dst->m_sn0 = dst->m_sn[0].m_sn;
        dst->m_sn1 = dst->m_sn[dst->m_count - 1].m_sn;
      }
      n = 0;
      local_28 = local_2c;
      while (local_28 < src->m_count) {
        memcpy(src->m_sn + n,src->m_sn + local_28,0x38);
        local_28 = local_28 + 1;
        n = n + 1;
      }
      src->m_count = n;
      if (src->m_count == 0) {
        ON_SN_BLOCK::EmptyBlock(src);
      }
      else if (src->m_sorted != 0) {
        src->m_sn0 = src->m_sn[0].m_sn;
      }
    }
  }
  return (ulong)local_2c;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GarbageCollectMoveHelper(ON_SN_BLOCK* dst,ON_SN_BLOCK* src)
{
  // This helper is used by GarbageCollectHelper and moves
  // as many entries as possible from src to dst.  
  // Returns: the number of entries transferred.
  ON__UINT32 i,j,n;
  if ( src && dst )
  {
    n = ON_SN_BLOCK::SN_BLOCK_CAPACITY - dst->m_count;
    if ( src->m_count < n )
      n = src->m_count;
    if ( n > 0 )
    {
      if ( 0 == dst->m_count )
      {
        dst->EmptyBlock();
      }
      if ( 0 == src->m_sorted )
      {
        dst->m_sorted = 0;
        if ( 0 == dst->m_count )
        {
          dst->m_sn0 = src->m_sn0;
          dst->m_sn1 = src->m_sn1;
        }
      }
      memcpy(&dst->m_sn[dst->m_count],&src->m_sn[0],(size_t)(n*sizeof(src->m_sn[0])));
      dst->m_count += n;
      if ( dst->m_sorted )
      {
        dst->m_sn0 = dst->m_sn[0].m_sn; // set m_sn0 because input dst could have count 0
        dst->m_sn1 = dst->m_sn[dst->m_count-1].m_sn;
      }
      else 
      {
        if ( dst->m_sn0 > src->m_sn0 )
          dst->m_sn0 = src->m_sn0;
        if ( dst->m_sn1 < src->m_sn1 )
          dst->m_sn1 = src->m_sn1;
      }
      i = 0; j = n;
      while ( j < src->m_count )
      {
        src->m_sn[i++] = src->m_sn[j++];
      }
      src->m_count = i;
      if ( src->m_count > 0 )
      {
        if ( src->m_sorted )
          src->m_sn0 = src->m_sn[0].m_sn;
      }
      else
      {
        src->EmptyBlock();
      }
    }
  }
  else
  {
    n = 0;
  }
  return n;
}